

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::LRNLayerParams::_InternalParse
          (LRNLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *p;
  char cVar4;
  uint uVar5;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  float *local_38;
  
  local_38 = (float *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_38;
      uVar5 = (uint)bVar1;
      p = (float *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar6 = google::protobuf::internal::ReadTagFallback((char *)local_38,uVar5);
          p = (float *)pVar6.first;
          uVar5 = pVar6.second;
        }
        else {
          p = (float *)((long)local_38 + 2);
        }
      }
      cVar4 = (char)uVar5;
      local_38 = p;
      switch(uVar5 >> 3) {
      case 1:
        if (cVar4 != '\r') break;
        this->alpha_ = *p;
LAB_0027062d:
        local_38 = p + 1;
        goto LAB_0027066f;
      case 2:
        if (cVar4 == '\x15') {
          this->beta_ = *p;
          goto LAB_0027062d;
        }
        break;
      case 3:
        if (cVar4 != '\x18') break;
        uVar3 = (ulong)(char)*(byte *)p;
        local_38 = (float *)((long)p + 1);
        if (-1 < (long)uVar3) {
LAB_00270601:
          this->localsize_ = uVar3;
          goto LAB_0027066f;
        }
        uVar5 = ((uint)*(byte *)local_38 * 0x80 + (uint)*(byte *)p) - 0x80;
        if (-1 < (char)*(byte *)local_38) {
          uVar3 = (ulong)uVar5;
          local_38 = (float *)((long)p + 2);
          goto LAB_00270601;
        }
        local_38 = p;
        pVar7 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar5);
        local_38 = (float *)pVar7.first;
        this->localsize_ = pVar7.second;
        goto LAB_0027066a;
      case 4:
        if (cVar4 == '%') {
          this->k_ = *p;
          goto LAB_0027062d;
        }
      }
      if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
        if (p == (float *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
        return (char *)p;
      }
      uVar3 = this_00->ptr_;
      if ((uVar3 & 1) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((uVar3 & 0xfffffffffffffffc) + 8);
      }
      local_38 = (float *)google::protobuf::internal::UnknownFieldParse
                                    (uVar5,unknown,(char *)local_38,ctx);
LAB_0027066a:
      if (local_38 == (float *)0x0) {
        return (char *)0x0;
      }
LAB_0027066f:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_38;
}

Assistant:

const char* LRNLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // float alpha = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 13)) {
          alpha_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float beta = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          beta_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // uint64 localSize = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          localsize_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float k = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 37)) {
          k_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}